

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void Eigen::internal::computeProductBlockingSizes<double,double,4,long>(long *k,long *m,long *n)

{
  long *plVar1;
  ulong local_48;
  long _m;
  ulong local_30;
  ptrdiff_t l2;
  ptrdiff_t l1;
  long *n_local;
  long *m_local;
  long *k_local;
  
  l1 = (ptrdiff_t)n;
  n_local = m;
  m_local = k;
  ignore_unused_variable<long>(n);
  manage_caching_sizes(GetAction,&l2,(ptrdiff_t *)&local_30);
  _m = l2 / 0x200;
  plVar1 = std::min<long>(m_local,&_m);
  *m_local = *plVar1;
  if (*m_local < 1) {
    local_48 = 0;
  }
  else {
    local_48 = local_30 / (ulong)(*m_local << 5);
  }
  if ((long)local_48 < *n_local) {
    *n_local = local_48 & 0xfffffffc;
  }
  return;
}

Assistant:

void computeProductBlockingSizes(SizeType& k, SizeType& m, SizeType& n)
{
  EIGEN_UNUSED_VARIABLE(n);
  // Explanations:
  // Let's recall the product algorithms form kc x nc horizontal panels B' on the rhs and
  // mc x kc blocks A' on the lhs. A' has to fit into L2 cache. Moreover, B' is processed
  // per kc x nr vertical small panels where nr is the blocking size along the n dimension
  // at the register level. For vectorization purpose, these small vertical panels are unpacked,
  // e.g., each coefficient is replicated to fit a packet. This small vertical panel has to
  // stay in L1 cache.
  std::ptrdiff_t l1, l2;

  typedef gebp_traits<LhsScalar,RhsScalar> Traits;
  enum {
    kdiv = KcFactor * 2 * Traits::nr
         * Traits::RhsProgress * sizeof(RhsScalar),
    mr = gebp_traits<LhsScalar,RhsScalar>::mr,
    mr_mask = (0xffffffff/mr)*mr
  };

  manage_caching_sizes(GetAction, &l1, &l2);
  k = std::min<SizeType>(k, l1/kdiv);
  SizeType _m = k>0 ? l2/(4 * sizeof(LhsScalar) * k) : 0;
  if(_m<m) m = _m & mr_mask;
}